

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O0

void FBehavior::StaticStartTypedScripts
               (WORD type,AActor *activator,bool always,int arg1,bool runNow)

{
  uint uVar1;
  FBehavior **ppFVar2;
  char *local_38;
  uint local_28;
  uint i;
  bool runNow_local;
  int arg1_local;
  bool always_local;
  AActor *activator_local;
  WORD type_local;
  
  if (type < 0x10) {
    local_38 = StaticStartTypedScripts::TypeNames[type];
  }
  else {
    local_38 = "Unknown";
  }
  DPrintf(3,"Starting all scripts of type %d (%s)\n",(ulong)type,local_38);
  local_28 = 0;
  while( true ) {
    uVar1 = TArray<FBehavior_*,_FBehavior_*>::Size(&StaticModules);
    if (uVar1 <= local_28) break;
    ppFVar2 = TArray<FBehavior_*,_FBehavior_*>::operator[](&StaticModules,(ulong)local_28);
    StartTypedScripts(*ppFVar2,type,activator,always,arg1,runNow);
    local_28 = local_28 + 1;
  }
  return;
}

Assistant:

void FBehavior::StaticStartTypedScripts (WORD type, AActor *activator, bool always, int arg1, bool runNow)
{
	static const char *const TypeNames[] =
	{
		"Closed",
		"Open",
		"Respawn",
		"Death",
		"Enter",
		"Pickup",
		"BlueReturn",
		"RedReturn",
		"WhiteReturn",
		"Unknown", "Unknown", "Unknown",
		"Lightning",
		"Unloading",
		"Disconnect",
		"Return"
	};
	DPrintf(DMSG_NOTIFY, "Starting all scripts of type %d (%s)\n", type,
		type < countof(TypeNames) ? TypeNames[type] : TypeNames[SCRIPT_Lightning - 1]);
	for (unsigned int i = 0; i < StaticModules.Size(); ++i)
	{
		StaticModules[i]->StartTypedScripts (type, activator, always, arg1, runNow);
	}
}